

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O1

void firstSatGroup(int g,int sign)

{
  int iVar1;
  int iVar2;
  Clause *pCVar3;
  int *piVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  piVar4 = permute;
  pCVar3 = clauseArray;
  if (1 < groupSize) {
    iVar5 = 1;
    lVar6 = 2;
    do {
      lVar7 = lVar6;
      if (iVar5 < groupSize) {
        do {
          lVar8 = (long)clauseCount;
          clauseCount = clauseCount + 1;
          iVar1 = piVar4[groupSize * g + iVar5];
          iVar2 = piVar4[groupSize * g + lVar7];
          pCVar3[lVar8].numOfVariables = 2;
          pCVar3[lVar8].variables[0] = iVar1 * sign;
          pCVar3[lVar8].variables[1] = iVar2 * sign;
          iVar1 = (int)lVar7;
          lVar7 = lVar7 + 1;
        } while (iVar1 < groupSize);
      }
      iVar5 = iVar5 + 1;
      lVar6 = lVar6 + 1;
    } while (iVar5 < groupSize);
  }
  return;
}

Assistant:

void firstSatGroup (int g, int sign)
{
    int i,j;

    for (i=1;i<groupSize;i++)
        for (j=i+1;j<=groupSize;j++)
            set2Clause (&(clauseArray[clauseCount++]), sign*permute[g*groupSize+i], sign*permute[g*groupSize+j]);

}